

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_type_range
                 (lysc_ctx *ctx,lysp_restr *range_p,LY_DATA_TYPE basetype,ly_bool length_restr,
                 uint8_t frdigits,lysc_range *base_range,lysc_range **range)

{
  bool bVar1;
  int iVar2;
  ushort **ppuVar3;
  long *plVar4;
  anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *paVar5;
  lysc_range *plVar6;
  char *pcVar7;
  bool bVar8;
  char *local_130;
  int64_t local_118;
  long local_110;
  long local_f0;
  int64_t local_e0;
  long local_d8;
  long local_b8;
  uint64_t local_a8;
  uint64_t local_a0;
  long *local_90;
  char *p___2;
  char *p___1;
  char *p__;
  uint64_t v;
  uint64_t u;
  uint64_t parts_done;
  ly_bool uns;
  ly_bool range_expected;
  lysc_range_part *part;
  lysc_range_part *parts;
  char *expr;
  lysc_range *plStack_38;
  LY_ERR ret;
  lysc_range *base_range_local;
  uint8_t frdigits_local;
  ly_bool length_restr_local;
  lysp_restr *plStack_28;
  LY_DATA_TYPE basetype_local;
  lysp_restr *range_p_local;
  lysc_ctx *ctx_local;
  
  expr._4_4_ = LY_SUCCESS;
  part = (lysc_range_part *)0x0;
  bVar1 = false;
  u = 0;
  plStack_38 = base_range;
  base_range_local._2_1_ = frdigits;
  base_range_local._3_1_ = length_restr;
  base_range_local._4_4_ = basetype;
  plStack_28 = range_p;
  range_p_local = (lysp_restr *)ctx;
  if (range == (lysc_range **)0x0) {
    __assert_fail("range",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x360,
                  "LY_ERR lys_compile_type_range(struct lysc_ctx *, const struct lysp_restr *, LY_DATA_TYPE, ly_bool, uint8_t, struct lysc_range *, struct lysc_range **)"
                 );
  }
  if (range_p == (lysp_restr *)0x0) {
    __assert_fail("range_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0x361,
                  "LY_ERR lys_compile_type_range(struct lysc_ctx *, const struct lysp_restr *, LY_DATA_TYPE, ly_bool, uint8_t, struct lysc_range *, struct lysc_range **)"
                 );
  }
  parts = (lysc_range_part *)(range_p->arg).str;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (ppuVar3 = __ctype_b_loc(),
                ((*ppuVar3)[(int)*(char *)&parts->field_0] & 0x2000) != 0) {
            parts = (lysc_range_part *)((long)&parts->field_0 + 1);
          }
          if (*(char *)&parts->field_0 == '\0') {
            if (bVar1) {
              pcVar7 = "range";
              if (base_range_local._3_1_ != '\0') {
                pcVar7 = "length";
              }
              ly_vlog((ly_ctx *)(range_p_local->arg).str,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid %s restriction - unexpected end of the expression after \"..\" (%s)."
                      ,pcVar7,(plStack_28->arg).str);
              expr._4_4_ = LY_EVALID;
              goto LAB_00169f59;
            }
            if (part != (lysc_range_part *)0x0) {
              if (part == (lysc_range_part *)0x0) {
                local_a0 = 0;
              }
              else {
                local_a0 = part[-1].field_1.max_64;
              }
              if (u != local_a0) {
                if (plStack_38 == (lysc_range *)0x0) goto LAB_00169d9b;
                if (base_range_local._4_4_ - LY_TYPE_BINARY < 6) {
                  bVar1 = true;
                }
                else {
                  if ((base_range_local._4_4_ != LY_TYPE_DEC64) &&
                     (3 < base_range_local._4_4_ - LY_TYPE_INT8)) {
                    ly_log((ly_ctx *)(range_p_local->arg).str,LY_LLERR,LY_EINT,
                           "Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                           ,0x3da);
                    expr._4_4_ = LY_EINT;
                    goto LAB_00169f59;
                  }
                  bVar1 = false;
                }
                p__ = (char *)0x0;
                v = 0;
                goto LAB_00169a12;
              }
            }
            pcVar7 = "range";
            if (base_range_local._3_1_ != '\0') {
              pcVar7 = "length";
            }
            ly_vlog((ly_ctx *)(range_p_local->arg).str,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid %s restriction - unexpected end of the expression (%s).",pcVar7,
                    (plStack_28->arg).str);
            expr._4_4_ = LY_EVALID;
            goto LAB_00169f59;
          }
          iVar2 = strncmp((char *)parts,"min",3);
          if (iVar2 != 0) break;
          if (part != (lysc_range_part *)0x0) {
            pcVar7 = "range";
            if (base_range_local._3_1_ != '\0') {
              pcVar7 = "length";
            }
            ly_vlog((ly_ctx *)(range_p_local->arg).str,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid %s restriction - unexpected data before min keyword (%.*s).",pcVar7,
                    (ulong)(uint)((int)parts - (int)(plStack_28->arg).str),(plStack_28->arg).str);
            expr._4_4_ = LY_EVALID;
            goto LAB_00169f59;
          }
          parts = (lysc_range_part *)((long)&parts->field_0 + 3);
          plVar4 = (long *)malloc(0x18);
          if (plVar4 == (long *)0x0) {
            ly_log((ly_ctx *)(range_p_local->arg).str,LY_LLERR,LY_EMEM,
                   "Memory allocation failed (%s()).","lys_compile_type_range");
            expr._4_4_ = LY_EMEM;
            goto LAB_00169f59;
          }
          *plVar4 = 1;
          part = (lysc_range_part *)(plVar4 + 1);
          paVar5 = (anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *)(part + *plVar4 + -1);
          memset(paVar5,0,0x10);
          expr._4_4_ = range_part_minmax((lysc_ctx *)range_p_local,(lysc_range_part *)paVar5,'\0',0,
                                         base_range_local._4_4_,'\x01',base_range_local._3_1_,
                                         base_range_local._2_1_,plStack_38,(char **)0x0);
          if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
          paVar5[1] = *paVar5;
        }
        if (*(char *)&parts->field_0 != '|') break;
        if ((part == (lysc_range_part *)0x0) || (bVar1)) {
          pcVar7 = "range";
          if (base_range_local._3_1_ != '\0') {
            pcVar7 = "length";
          }
          ly_vlog((ly_ctx *)(range_p_local->arg).str,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid %s restriction - unexpected beginning of the expression (%s).",pcVar7,
                  parts);
          expr._4_4_ = LY_EVALID;
          goto LAB_00169f59;
        }
        parts = (lysc_range_part *)((long)&parts->field_0 + 1);
        u = u + 1;
      }
      iVar2 = strncmp((char *)parts,"..",2);
      if (iVar2 == 0) break;
      ppuVar3 = __ctype_b_loc();
      if (((((*ppuVar3)[(int)*(char *)&parts->field_0] & 0x800) == 0) &&
          (*(char *)&parts->field_0 != '-')) && (*(char *)&parts->field_0 != '+')) {
        iVar2 = strncmp((char *)parts,"max",3);
        if (iVar2 != 0) {
          pcVar7 = "range";
          if (base_range_local._3_1_ != '\0') {
            pcVar7 = "length";
          }
          ly_vlog((ly_ctx *)(range_p_local->arg).str,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid %s restriction - unexpected data (%s).",pcVar7,parts);
          expr._4_4_ = LY_EVALID;
          goto LAB_00169f59;
        }
        parts = (lysc_range_part *)((long)&parts->field_0 + 3);
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)&parts->field_0] & 0x2000) != 0)
        {
          parts = (lysc_range_part *)((long)&parts->field_0 + 1);
        }
        if (*(char *)&parts->field_0 != '\0') {
          pcVar7 = "range";
          if (base_range_local._3_1_ != '\0') {
            pcVar7 = "length";
          }
          ly_vlog((ly_ctx *)(range_p_local->arg).str,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid %s restriction - unexpected data after max keyword (%s).",pcVar7,parts);
          expr._4_4_ = LY_EVALID;
          goto LAB_00169f59;
        }
        if (bVar1) {
          if (part == (lysc_range_part *)0x0) {
            local_f0 = 0;
          }
          else {
            local_f0 = part[-1].field_1.max_64;
          }
          expr._4_4_ = range_part_minmax((lysc_ctx *)range_p_local,part + local_f0 + -1,'\x01',
                                         part[local_f0 + -1].field_0.min_64,base_range_local._4_4_,
                                         '\0',base_range_local._3_1_,base_range_local._2_1_,
                                         plStack_38,(char **)0x0);
          if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
          bVar1 = false;
        }
        else {
          if (part == (lysc_range_part *)0x0) {
            local_90 = (long *)malloc(0x18);
            if (local_90 == (long *)0x0) {
              ly_log((ly_ctx *)(range_p_local->arg).str,LY_LLERR,LY_EMEM,
                     "Memory allocation failed (%s()).","lys_compile_type_range");
              expr._4_4_ = LY_EMEM;
              goto LAB_00169f59;
            }
            *local_90 = 1;
          }
          else {
            part[-1].field_1.max_64 = part[-1].field_1.max_64 + 1;
            local_90 = (long *)realloc(&part[-1].field_1,part[-1].field_1.max_64 * 0x10 + 8);
            if (local_90 == (long *)0x0) {
              part[-1].field_1.max_64 = part[-1].field_1.max_64 + -1;
              ly_log((ly_ctx *)(range_p_local->arg).str,LY_LLERR,LY_EMEM,
                     "Memory allocation failed (%s()).","lys_compile_type_range");
              expr._4_4_ = LY_EMEM;
              goto LAB_00169f59;
            }
          }
          part = (lysc_range_part *)(local_90 + 1);
          paVar5 = (anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *)(part + *local_90 + -1);
          memset(paVar5,0,0x10);
          if (u == 0) {
            local_118 = 0;
          }
          else {
            if (part == (lysc_range_part *)0x0) {
              local_110 = 0;
            }
            else {
              local_110 = *local_90;
            }
            local_118 = part[local_110 + -2].field_1.max_64;
          }
          expr._4_4_ = range_part_minmax((lysc_ctx *)range_p_local,(lysc_range_part *)paVar5,'\x01',
                                         local_118,base_range_local._4_4_,u == 0,
                                         base_range_local._3_1_,base_range_local._2_1_,plStack_38,
                                         (char **)0x0);
          if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
          *paVar5 = paVar5[1];
        }
      }
      else if (bVar1) {
        if (part == (lysc_range_part *)0x0) {
          local_b8 = 0;
        }
        else {
          local_b8 = part[-1].field_1.max_64;
        }
        expr._4_4_ = range_part_minmax((lysc_ctx *)range_p_local,part + local_b8 + -1,'\x01',
                                       part[local_b8 + -1].field_0.min_64,base_range_local._4_4_,
                                       '\0',base_range_local._3_1_,base_range_local._2_1_,
                                       (lysc_range *)0x0,(char **)&parts);
        if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
        bVar1 = false;
      }
      else {
        if (part == (lysc_range_part *)0x0) {
          p___2 = (char *)malloc(0x18);
          if (p___2 == (char *)0x0) {
            ly_log((ly_ctx *)(range_p_local->arg).str,LY_LLERR,LY_EMEM,
                   "Memory allocation failed (%s()).","lys_compile_type_range");
            expr._4_4_ = LY_EMEM;
            goto LAB_00169f59;
          }
          p___2[0] = '\x01';
          p___2[1] = '\0';
          p___2[2] = '\0';
          p___2[3] = '\0';
          p___2[4] = '\0';
          p___2[5] = '\0';
          p___2[6] = '\0';
          p___2[7] = '\0';
        }
        else {
          part[-1].field_1.max_64 = part[-1].field_1.max_64 + 1;
          p___2 = (char *)realloc(&part[-1].field_1,part[-1].field_1.max_64 * 0x10 + 8);
          if (p___2 == (char *)0x0) {
            part[-1].field_1.max_64 = part[-1].field_1.max_64 + -1;
            ly_log((ly_ctx *)(range_p_local->arg).str,LY_LLERR,LY_EMEM,
                   "Memory allocation failed (%s()).","lys_compile_type_range");
            expr._4_4_ = LY_EMEM;
            goto LAB_00169f59;
          }
        }
        part = (lysc_range_part *)(p___2 + 8);
        paVar5 = (anon_union_8_2_6b5dfd82_for_lysc_range_part_2 *)(part + *(long *)p___2 + -1);
        memset(paVar5,0,0x10);
        if (u == 0) {
          local_e0 = 0;
        }
        else {
          if (part == (lysc_range_part *)0x0) {
            local_d8 = 0;
          }
          else {
            local_d8 = *(long *)p___2;
          }
          local_e0 = part[local_d8 + -2].field_1.max_64;
        }
        expr._4_4_ = range_part_minmax((lysc_ctx *)range_p_local,(lysc_range_part *)paVar5,'\0',
                                       local_e0,base_range_local._4_4_,u == 0,base_range_local._3_1_
                                       ,base_range_local._2_1_,(lysc_range *)0x0,(char **)&parts);
        if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
        paVar5[1] = *paVar5;
      }
    }
    parts = (lysc_range_part *)((long)&parts->field_0 + 2);
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)&parts->field_0] & 0x2000) != 0) {
      parts = (lysc_range_part *)((long)&parts->field_0 + 1);
    }
    if (part == (lysc_range_part *)0x0) break;
    if (part == (lysc_range_part *)0x0) {
      local_a8 = 0;
    }
    else {
      local_a8 = part[-1].field_1.max_64;
    }
    if (local_a8 == u) break;
    bVar1 = true;
  }
  pcVar7 = "range";
  if (base_range_local._3_1_ != '\0') {
    pcVar7 = "length";
  }
  ly_vlog((ly_ctx *)(range_p_local->arg).str,(char *)0x0,LYVE_SYNTAX_YANG,
          "Invalid %s restriction - unexpected \"..\" without a lower bound.",pcVar7);
  expr._4_4_ = LY_EVALID;
  goto LAB_00169f59;
LAB_00169d9b:
  if (*range == (lysc_range *)0x0) {
    plVar6 = (lysc_range *)calloc(1,0x30);
    *range = plVar6;
    if (*range == (lysc_range *)0x0) {
      ly_log((ly_ctx *)(range_p_local->arg).str,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_type_range");
      return LY_EMEM;
    }
  }
  if (plStack_28->eapptag != (char *)0x0) {
    lydict_remove((ly_ctx *)(range_p_local->arg).str,(*range)->eapptag);
    expr._4_4_ = lydict_insert((ly_ctx *)(range_p_local->arg).str,plStack_28->eapptag,0,
                               &(*range)->eapptag);
    if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
  }
  if (plStack_28->emsg != (char *)0x0) {
    lydict_remove((ly_ctx *)(range_p_local->arg).str,(*range)->emsg);
    expr._4_4_ = lydict_insert((ly_ctx *)(range_p_local->arg).str,plStack_28->emsg,0,&(*range)->emsg
                              );
    if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
  }
  if (plStack_28->dsc != (char *)0x0) {
    lydict_remove((ly_ctx *)(range_p_local->arg).str,(*range)->dsc);
    expr._4_4_ = lydict_insert((ly_ctx *)(range_p_local->arg).str,plStack_28->dsc,0,&(*range)->dsc);
    if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
  }
  if (plStack_28->ref != (char *)0x0) {
    lydict_remove((ly_ctx *)(range_p_local->arg).str,(*range)->ref);
    expr._4_4_ = lydict_insert((ly_ctx *)(range_p_local->arg).str,plStack_28->ref,0,&(*range)->ref);
    if (expr._4_4_ != LY_SUCCESS) goto LAB_00169f59;
  }
  (*range)->parts = part;
  part = (lysc_range_part *)0x0;
  goto LAB_00169f59;
LAB_00169a12:
  bVar8 = false;
  if (v < u + 1) {
    if (plStack_38->parts == (lysc_range_part *)0x0) {
      local_130 = (char *)0x0;
    }
    else {
      local_130 = (char *)plStack_38->parts[-1].field_1.max_u64;
    }
    bVar8 = p__ < local_130;
  }
  if (bVar8) {
    if (((bVar1) && (part[v].field_0.min_u64 < plStack_38->parts[(long)p__].field_0.min_u64)) ||
       ((!bVar1 && (part[v].field_0.min_64 < plStack_38->parts[(long)p__].field_0.min_64))))
    goto LAB_00169d4f;
    if (plStack_38->parts[(long)p__].field_0.min_64 == plStack_38->parts[(long)p__].field_1.max_64)
    {
      if (plStack_38->parts[(long)p__].field_0.min_64 == part[v].field_0.min_64) {
        if (part[v].field_0.min_64 != part[v].field_1.max_64) goto LAB_00169d4f;
        p__ = p__ + 1;
      }
      else {
        p__ = p__ + 1;
        v = v - 1;
      }
    }
    else if (part[v].field_0.min_64 == part[v].field_1.max_64) {
      if (((bVar1) && (plStack_38->parts[(long)p__].field_1.max_u64 < part[v].field_1.max_u64)) ||
         ((!bVar1 && (plStack_38->parts[(long)p__].field_1.max_64 < part[v].field_1.max_64)))) {
        p__ = p__ + 1;
        v = v - 1;
      }
    }
    else if (((bVar1) && (plStack_38->parts[(long)p__].field_1.max_u64 < part[v].field_1.max_u64))
            || ((!bVar1 && (plStack_38->parts[(long)p__].field_1.max_64 < part[v].field_1.max_64))))
    {
      if (((!bVar1) || (part[v].field_0.min_u64 <= plStack_38->parts[(long)p__].field_1.max_u64)) &&
         ((bVar1 || (part[v].field_0.min_64 <= plStack_38->parts[(long)p__].field_1.max_64))))
      goto LAB_00169d4f;
      v = v - 1;
      p__ = p__ + 1;
    }
    v = v + 1;
    goto LAB_00169a12;
  }
  if (v == u + 1) goto LAB_00169d9b;
LAB_00169d4f:
  pcVar7 = "range";
  if (base_range_local._3_1_ != '\0') {
    pcVar7 = "length";
  }
  ly_vlog((ly_ctx *)(range_p_local->arg).str,(char *)0x0,LYVE_SYNTAX_YANG,
          "Invalid %s restriction - the derived restriction (%s) is not equally or more limiting.",
          pcVar7,(plStack_28->arg).str);
  expr._4_4_ = LY_EVALID;
LAB_00169f59:
  if (part != (lysc_range_part *)0x0) {
    free(&part[-1].field_1);
  }
  return expr._4_4_;
}

Assistant:

LY_ERR
lys_compile_type_range(struct lysc_ctx *ctx, const struct lysp_restr *range_p, LY_DATA_TYPE basetype, ly_bool length_restr,
        uint8_t frdigits, struct lysc_range *base_range, struct lysc_range **range)
{
    LY_ERR ret = LY_SUCCESS;
    const char *expr;
    struct lysc_range_part *parts = NULL, *part;
    ly_bool range_expected = 0, uns;
    LY_ARRAY_COUNT_TYPE parts_done = 0, u, v;

    assert(range);
    assert(range_p);

    expr = range_p->arg.str;
    while (1) {
        if (isspace(*expr)) {
            ++expr;
        } else if (*expr == '\0') {
            if (range_expected) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected end of the expression after \"..\" (%s).",
                        length_restr ? "length" : "range", range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            } else if (!parts || (parts_done == LY_ARRAY_COUNT(parts))) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected end of the expression (%s).",
                        length_restr ? "length" : "range", range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            }
            parts_done++;
            break;
        } else if (!strncmp(expr, "min", ly_strlen_const("min"))) {
            if (parts) {
                /* min cannot be used elsewhere than in the first part */
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected data before min keyword (%.*s).", length_restr ? "length" : "range",
                        (int)(expr - range_p->arg.str), range_p->arg.str);
                ret = LY_EVALID;
                goto cleanup;
            }
            expr += ly_strlen_const("min");

            LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
            LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 0, 0, basetype, 1, length_restr, frdigits, base_range, NULL), cleanup);
            part->max_64 = part->min_64;
        } else if (*expr == '|') {
            if (!parts || range_expected) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected beginning of the expression (%s).", length_restr ? "length" : "range", expr);
                ret = LY_EVALID;
                goto cleanup;
            }
            expr++;
            parts_done++;
            /* process next part of the expression */
        } else if (!strncmp(expr, "..", 2)) {
            expr += 2;
            while (isspace(*expr)) {
                expr++;
            }
            if (!parts || (LY_ARRAY_COUNT(parts) == parts_done)) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s restriction - unexpected \"..\" without a lower bound.", length_restr ? "length" : "range");
                ret = LY_EVALID;
                goto cleanup;
            }
            /* continue expecting the upper boundary */
            range_expected = 1;
        } else if (isdigit(*expr) || (*expr == '-') || (*expr == '+')) {
            /* number */
            if (range_expected) {
                part = &parts[LY_ARRAY_COUNT(parts) - 1];
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, part->min_64, basetype, 0, length_restr, frdigits, NULL, &expr), cleanup);
                range_expected = 0;
            } else {
                LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 0, parts_done ? parts[LY_ARRAY_COUNT(parts) - 2].max_64 : 0,
                        basetype, parts_done ? 0 : 1, length_restr, frdigits, NULL, &expr), cleanup);
                part->max_64 = part->min_64;
            }

            /* continue with possible another expression part */
        } else if (!strncmp(expr, "max", ly_strlen_const("max"))) {
            expr += ly_strlen_const("max");
            while (isspace(*expr)) {
                expr++;
            }
            if (*expr != '\0') {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s restriction - unexpected data after max keyword (%s).",
                        length_restr ? "length" : "range", expr);
                ret = LY_EVALID;
                goto cleanup;
            }
            if (range_expected) {
                part = &parts[LY_ARRAY_COUNT(parts) - 1];
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, part->min_64, basetype, 0, length_restr, frdigits, base_range, NULL), cleanup);
                range_expected = 0;
            } else {
                LY_ARRAY_NEW_GOTO(ctx->ctx, parts, part, ret, cleanup);
                LY_CHECK_GOTO(ret = range_part_minmax(ctx, part, 1, parts_done ? parts[LY_ARRAY_COUNT(parts) - 2].max_64 : 0,
                        basetype, parts_done ? 0 : 1, length_restr, frdigits, base_range, NULL), cleanup);
                part->min_64 = part->max_64;
            }
        } else {
            LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s restriction - unexpected data (%s).",
                    length_restr ? "length" : "range", expr);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    /* check with the previous range/length restriction */
    if (base_range) {
        switch (basetype) {
        case LY_TYPE_BINARY:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
        case LY_TYPE_STRING:
            uns = 1;
            break;
        case LY_TYPE_DEC64:
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
            uns = 0;
            break;
        default:
            LOGINT(ctx->ctx);
            ret = LY_EINT;
            goto cleanup;
        }
        for (u = v = 0; u < parts_done && v < LY_ARRAY_COUNT(base_range->parts); ++u) {
            if ((uns && (parts[u].min_u64 < base_range->parts[v].min_u64)) || (!uns && (parts[u].min_64 < base_range->parts[v].min_64))) {
                goto baseerror;
            }
            /* current lower bound is not lower than the base */
            if (base_range->parts[v].min_64 == base_range->parts[v].max_64) {
                /* base has single value */
                if (base_range->parts[v].min_64 == parts[u].min_64) {
                    /* both lower bounds are the same */
                    if (parts[u].min_64 != parts[u].max_64) {
                        /* current continues with a range */
                        goto baseerror;
                    } else {
                        /* equal single values, move both forward */
                        ++v;
                        continue;
                    }
                } else {
                    /* base is single value lower than current range, so the
                     * value from base range is removed in the current,
                     * move only base and repeat checking */
                    ++v;
                    --u;
                    continue;
                }
            } else {
                /* base is the range */
                if (parts[u].min_64 == parts[u].max_64) {
                    /* current is a single value */
                    if ((uns && (parts[u].max_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].max_64 > base_range->parts[v].max_64))) {
                        /* current is behind the base range, so base range is omitted,
                         * move the base and keep the current for further check */
                        ++v;
                        --u;
                    } /* else it is within the base range, so move the current, but keep the base */
                    continue;
                } else {
                    /* both are ranges - check the higher bound, the lower was already checked */
                    if ((uns && (parts[u].max_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].max_64 > base_range->parts[v].max_64))) {
                        /* higher bound is higher than the current higher bound */
                        if ((uns && (parts[u].min_u64 > base_range->parts[v].max_u64)) || (!uns && (parts[u].min_64 > base_range->parts[v].max_64))) {
                            /* but the current lower bound is also higher, so the base range is omitted,
                             * continue with the same current, but move the base */
                            --u;
                            ++v;
                            continue;
                        }
                        /* current range starts within the base range but end behind it */
                        goto baseerror;
                    } else {
                        /* current range is smaller than the base,
                         * move current, but stay with the base */
                        continue;
                    }
                }
            }
        }
        if (u != parts_done) {
baseerror:
            LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                    "Invalid %s restriction - the derived restriction (%s) is not equally or more limiting.",
                    length_restr ? "length" : "range", range_p->arg.str);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    if (!(*range)) {
        *range = calloc(1, sizeof **range);
        LY_CHECK_ERR_RET(!(*range), LOGMEM(ctx->ctx), LY_EMEM);
    }

    /* we rewrite the following values as the types chain is being processed */
    if (range_p->eapptag) {
        lydict_remove(ctx->ctx, (*range)->eapptag);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->eapptag, 0, &(*range)->eapptag), cleanup);
    }
    if (range_p->emsg) {
        lydict_remove(ctx->ctx, (*range)->emsg);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->emsg, 0, &(*range)->emsg), cleanup);
    }
    if (range_p->dsc) {
        lydict_remove(ctx->ctx, (*range)->dsc);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->dsc, 0, &(*range)->dsc), cleanup);
    }
    if (range_p->ref) {
        lydict_remove(ctx->ctx, (*range)->ref);
        LY_CHECK_GOTO(ret = lydict_insert(ctx->ctx, range_p->ref, 0, &(*range)->ref), cleanup);
    }
    /* extensions are taken only from the last range by the caller */

    (*range)->parts = parts;
    parts = NULL;
cleanup:
    LY_ARRAY_FREE(parts);

    return ret;
}